

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

cf_bool_t cf_str_center(cf_char_t *dst,cf_size_t size,cf_char_t *s,cf_char_t c,cf_size_t total)

{
  size_t sVar1;
  cf_char_t *pcVar2;
  long lVar3;
  cf_bool_t cVar4;
  
  cVar4 = 0;
  if (s != (cf_char_t *)0x0 && dst != (cf_char_t *)0x0) {
    sVar1 = strlen(s);
    if (total + 1 <= size && sVar1 + 1 <= size) {
      for (pcVar2 = dst; pcVar2 < dst + (total - sVar1 >> 1); pcVar2 = pcVar2 + 1) {
        *pcVar2 = c;
      }
      for (lVar3 = 0; s[lVar3] != '\0'; lVar3 = lVar3 + 1) {
        pcVar2[lVar3] = s[lVar3];
      }
      for (pcVar2 = pcVar2 + lVar3; pcVar2 < dst + total; pcVar2 = pcVar2 + 1) {
        *pcVar2 = c;
      }
      dst[total] = '\0';
      cVar4 = 1;
    }
  }
  return cVar4;
}

Assistant:

cf_bool_t cf_str_center(cf_char_t* dst, cf_size_t size, cf_char_t* s, cf_char_t c, cf_size_t total) {
    cf_size_t left = 0, len = 0;
    cf_char_t* p = CF_NULL_PTR;
    if (!dst || !s) {
        return CF_FALSE;
    }
    // no enough space to hold 
    len = strlen(s);
    if (len + 1 > size || total + 1 > size) {
        return CF_FALSE;
    }

    left = (total - len) / 2;
    p = dst;
    // fill left
    while (p < dst + left) {
        *p = c;
        p++;
    }
    // copy string
    while (*s != '\0') {
        *p = *s;
        s++;
        p++;
    }
    // fill right
    while (p < dst + total) {
        *p = c;
        p++;
    }
    dst[total] = '\0';
    
    return CF_TRUE;
}